

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O1

void __thiscall xray_re::xr_cform::optimize(xr_cform *this)

{
  pointer pcVar1;
  cf_face *pcVar2;
  long lVar3;
  bool bVar4;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  _Var5;
  pointer pcVar6;
  undefined7 extraout_var;
  long lVar8;
  cf_face *pcVar9;
  cf_face *face;
  ulong uVar7;
  
  _Var5 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_degenerate_pred>>
                    ((this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_start,
                     (this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_finish);
  pcVar9 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var5._M_current != pcVar9) &&
     (pcVar1 = (this->m_faces).
               super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pcVar6 = (pointer)((long)_Var5._M_current + ((long)pcVar1 - (long)pcVar9)), pcVar1 != pcVar6))
  {
    (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar6;
  }
  generate_vertex_faces(this);
  pcVar9 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar9 == pcVar2) {
      _Var5 = std::
              __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_duplicate_pred>>
                        ((this->m_faces).
                         super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (this->m_faces).
                         super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      pcVar9 = (this->m_faces).
               super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((_Var5._M_current != pcVar9) &&
         (pcVar1 = (this->m_faces).
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_finish,
         pcVar6 = (pointer)((long)_Var5._M_current + ((long)pcVar1 - (long)pcVar9)),
         pcVar1 != pcVar6)) {
        (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar6;
      }
      generate_vertex_faces(this);
      return;
    }
    if ((pcVar9->field_1).dummy != 0xffffffff) {
      uVar7 = (ulong)(this->m_vertices).
                     super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>.
                     _M_impl.super__Vector_impl_data._M_start[(pcVar9->field_0).field_0.v[0]].face0;
      while (uVar7 != 0xffffffff) {
        face = (this->m_faces).
               super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7;
        if (pcVar9 < face) {
          bVar4 = cf_face::is_duplicate(pcVar9,face);
          uVar7 = CONCAT71(extraout_var,bVar4);
          if (bVar4) {
            (face->field_1).dummy = 0xffffffff;
          }
        }
        lVar3 = 3;
        do {
          lVar8 = lVar3;
          if (lVar8 == 0) goto LAB_0014e61a;
          lVar3 = lVar8 + -1;
        } while (*(uint32_t *)((long)face + (lVar8 + -1) * 4) != (pcVar9->field_0).field_0.v[0]);
        uVar7 = (ulong)*(uint *)((long)&face->field_0 + lVar8 * 4 + 8);
LAB_0014e61a:
        if (lVar8 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_cform.h"
                        ,0x65,"uint_fast32_t xray_re::cf_face::next_face_idx(uint_fast32_t) const");
        }
      }
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

void xr_cform::optimize()
{
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_degenerate_pred()), m_faces.end());

	generate_vertex_faces();
	for (cf_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		if (it->dummy == BAD_IDX)
			continue;
		for (uint_fast32_t next = m_vertices[it->v0].face0; next != BAD_IDX;) {
			cf_face& face = m_faces[next];
			if (&face > &*it && it->is_duplicate(face))
				face.dummy = BAD_IDX;
			next = face.next_face_idx(it->v0);
		}
	}
//	size_t n = count_if(m_faces.begin(), m_faces.end(), is_duplicate());
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_duplicate_pred()), m_faces.end());
//	msg("CFORM optimize: was %"PRIuSIZE", left: %"PRIuSIZE"\n", n, m_faces.size());

	generate_vertex_faces();
}